

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3w.c
# Opt level: O2

int gl3wInit(void)

{
  int iVar1;
  
  libgl = (void *)dlopen("libGL.so.1",0x101);
  load_procs();
  dlclose(libgl);
  if (gl3wGetIntegerv == (PFNGLGETINTEGERVPROC)0x0) {
    iVar1 = -1;
  }
  else {
    (*gl3wGetIntegerv)(0x821b,&version.major);
    (*gl3wGetIntegerv)(0x821c,(GLint *)0x1d5a34);
    iVar1 = -(uint)(version.major < 3);
  }
  return iVar1;
}

Assistant:

int gl3wInit(void)
{
	open_libgl();
	load_procs();
	close_libgl();
	return parse_version();
}